

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBody::updateAtomVel(RigidBody *this,int frame)

{
  pointer pVVar1;
  Atom *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  Vector3d rbVel;
  Vector3d ji;
  Vector<double,_3U> local_198;
  Vector<double,_3U> local_180;
  Vector<double,_3U> local_168;
  Vector3d velRot;
  Mat3x3d mat;
  Mat3x3d skewMat;
  Mat3x3d I;
  
  SquareMatrix<double,_3>::SquareMatrix(&skewMat.super_SquareMatrix<double,_3>);
  StuntDouble::getJ(&ji,&this->super_StuntDouble,frame);
  (*(this->super_StuntDouble)._vptr_StuntDouble[5])(&I,this);
  skewMat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  skewMat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
       -ji.super_Vector<double,_3U>.data_[2] /
       I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  skewMat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  auVar6._8_8_ = -ji.super_Vector<double,_3U>.data_[1];
  auVar6._0_8_ = ji.super_Vector<double,_3U>.data_[2];
  auVar2._8_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  auVar2._0_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  skewMat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]._8_16_ =
       divpd(auVar6,auVar2);
  skewMat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
       -ji.super_Vector<double,_3U>.data_[0] /
       I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  auVar3._8_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  auVar3._0_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  skewMat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_._40_16_ =
       divpd((undefined1  [16])ji.super_Vector<double,_3U>.data_._0_16_,auVar3);
  skewMat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  StuntDouble::getA((RotMat3x3d *)&velRot,&this->super_StuntDouble,frame);
  operator*((SquareMatrix3<double> *)&rbVel,(SquareMatrix3<double> *)&velRot,&skewMat);
  SquareMatrix3<double>::transpose(&mat,(SquareMatrix3<double> *)&rbVel);
  StuntDouble::getVel(&rbVel,&this->super_StuntDouble,frame);
  Vector<double,_3U>::Vector(&velRot.super_Vector<double,_3U>);
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    pVVar1 = (this->refCoords_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->refCoords_).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x18) <= uVar5)
    break;
    this_00 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar5];
    operator*(&local_198,(RectMatrix<double,_3U,_3U> *)&mat,&pVVar1[uVar5].super_Vector<double,_3U>)
    ;
    OpenMD::operator+(&local_180,&rbVel.super_Vector<double,_3U>,&local_198);
    Vector<double,_3U>::Vector(&local_168,&local_180);
    StuntDouble::setVel(&this_00->super_StuntDouble,(Vector3d *)&local_168,frame);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void RigidBody::updateAtomVel(int frame) {
    Mat3x3d skewMat;
    ;

    Vector3d ji = getJ(frame);
    Mat3x3d I   = getI();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = ji[2] / I(2, 2);
    skewMat(0, 2) = -ji[1] / I(1, 1);

    skewMat(1, 0) = -ji[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = ji[0] / I(0, 0);

    skewMat(2, 0) = ji[1] / I(1, 1);
    skewMat(2, 1) = -ji[0] / I(0, 0);
    skewMat(2, 2) = 0;

    Mat3x3d mat    = (getA(frame) * skewMat).transpose();
    Vector3d rbVel = getVel(frame);

    Vector3d velRot;
    for (unsigned int i = 0; i < refCoords_.size(); ++i) {
      atoms_[i]->setVel(rbVel + mat * refCoords_[i], frame);
    }
  }